

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Bug3061120(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_5a8;
  StringPiece local_428;
  LogMessage local_418;
  StringPiece local_298;
  LogMessage local_288;
  StringPiece local_f8;
  undefined1 local_e8 [8];
  RE2 re;
  
  RE2::RE2((RE2 *)local_e8,"(?i)\\W");
  StringPiece::StringPiece(&local_f8,"x");
  bVar1 = RE2::PartialMatch<>(&local_f8,(RE2 *)local_e8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c7);
    poVar2 = LogMessage::stream(&local_288);
    std::operator<<(poVar2,"Check failed: !(RE2::PartialMatch(\"x\", re))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_288);
  }
  StringPiece::StringPiece(&local_298,"k");
  bVar1 = RE2::PartialMatch<>(&local_298,(RE2 *)local_e8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c8);
    poVar2 = LogMessage::stream(&local_418);
    std::operator<<(poVar2,"Check failed: !(RE2::PartialMatch(\"k\", re))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_418);
  }
  StringPiece::StringPiece(&local_428,"s");
  bVar1 = RE2::PartialMatch<>(&local_428,(RE2 *)local_e8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c9);
    poVar2 = LogMessage::stream(&local_5a8);
    std::operator<<(poVar2,"Check failed: !(RE2::PartialMatch(\"s\", re))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5a8);
  }
  RE2::~RE2((RE2 *)local_e8);
  return;
}

Assistant:

TEST(RE2, Bug3061120) {
  RE2 re("(?i)\\W");
  EXPECT_FALSE(RE2::PartialMatch("x", re));  // always worked
  EXPECT_FALSE(RE2::PartialMatch("k", re));  // broke because of kelvin
  EXPECT_FALSE(RE2::PartialMatch("s", re));  // broke because of latin long s
}